

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-optimizer.cpp
# Opt level: O0

bool is_best(context *ctx,result *current,result *best,objective_function_type type)

{
  bool bVar1;
  const_reference pvVar2;
  objective_function_type type_local;
  result *best_local;
  result *current_local;
  context *ctx_local;
  
  bVar1 = is_best(current,best,type);
  if (bVar1) {
    bVar1 = baryonyx::result::operator_cast_to_bool(current);
    if (bVar1) {
      pvVar2 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::front
                         (&current->solutions);
      baryonyx::notice<double>(ctx,"  - branch optimization found solution {:G}\n",&pvVar2->value);
    }
    else {
      baryonyx::notice<int>
                (ctx,"  - branch optimization remaining_constraint {}\n",
                 &current->remaining_constraints);
    }
    ctx_local._7_1_ = true;
  }
  else {
    ctx_local._7_1_ = false;
  }
  return ctx_local._7_1_;
}

Assistant:

static bool
is_best(const baryonyx::context& ctx,
        const baryonyx::result& current,
        const baryonyx::result& best,
        baryonyx::objective_function_type type)
{
    if (is_best(current, best, type)) {
        if (current)
            baryonyx::notice(ctx,
                             "  - branch optimization found solution {:G}\n",
                             current.solutions.front().value);
        else
            baryonyx::notice(
              ctx,
              "  - branch optimization remaining_constraint {}\n",
              current.remaining_constraints);

        return true;
    }

    return false;
}